

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

_Bool Curl_req_want_send(Curl_easy *data)

{
  _Bool _Var1;
  _Bool local_12;
  _Bool local_11;
  Curl_easy *data_local;
  
  local_11 = false;
  if ((*(uint *)&(data->req).field_0xd1 >> 1 & 1) == 0) {
    local_12 = true;
    if (((data->req).keepon & 0x2aU) != 2) {
      _Var1 = Curl_req_sendbuf_empty(data);
      local_12 = true;
      if (_Var1) {
        local_12 = Curl_xfer_needs_flush(data);
      }
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool Curl_req_want_send(struct Curl_easy *data)
{
  /* Not done and
   * - KEEP_SEND and not PAUSEd.
   * - or request has buffered data to send
   * - or transfer connection has pending data to send */
  return !data->req.done &&
         (((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) ||
           !Curl_req_sendbuf_empty(data) ||
           Curl_xfer_needs_flush(data));
}